

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_0::CWriter::WritePrefixBinaryExpr(CWriter *this,Opcode opcode,char *op)

{
  Newline local_6d;
  Type local_6c;
  StackVar local_64;
  Type local_58;
  StackVar local_50;
  Type local_44;
  StackVar local_3c;
  Type local_30;
  Type result_type;
  char *op_local;
  CWriter *this_local;
  Opcode opcode_local;
  
  result_type = (Type)op;
  this_local._4_4_ = opcode.enum_;
  local_44 = Opcode::GetResultType((Opcode *)((long)&this_local + 4));
  local_30 = local_44;
  StackVar::StackVar(&local_3c,1,local_44);
  Type::Type(&local_58,Any);
  StackVar::StackVar(&local_50,1,local_58);
  Type::Type(&local_6c,Any);
  StackVar::StackVar(&local_64,0,local_6c);
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[4],char_const*&,char_const(&)[2],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,&local_3c,(char (*) [4])0x37cd5f,(char **)&result_type,
             (char (*) [2])0x37d6a1,&local_50,(char (*) [3])0x37f5cf,&local_64,
             (char (*) [3])0x37d78e,&local_6d);
  DropTypes(this,2);
  PushType(this,local_30);
  return;
}

Assistant:

void CWriter::WritePrefixBinaryExpr(Opcode opcode, const char* op) {
  Type result_type = opcode.GetResultType();
  Write(StackVar(1, result_type), " = ", op, "(", StackVar(1), ", ",
        StackVar(0), ");", Newline());
  DropTypes(2);
  PushType(result_type);
}